

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O3

Exception * kj::Timer::makeTimeoutException(void)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [20];
  Exception *in_RDI;
  String local_28;
  
  kj::_::Debug::makeDescription<char_const(&)[20]>
            (&local_28,(Debug *)"\"operation timed out\"","operation timed out",in_RCX);
  Exception::Exception
            (in_RDI,OVERLOADED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/timer.c++"
             ,0x1e,&local_28);
  sVar2 = local_28.content.size_;
  pcVar1 = local_28.content.ptr;
  if (local_28.content.ptr != (char *)0x0) {
    local_28.content.ptr = (char *)0x0;
    local_28.content.size_ = 0;
    (**(local_28.content.disposer)->_vptr_ArrayDisposer)
              (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return in_RDI;
}

Assistant:

kj::Exception Timer::makeTimeoutException() {
  return KJ_EXCEPTION(OVERLOADED, "operation timed out");
}